

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_dynamic_content.hpp
# Opt level: O2

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,query_container *param_3)

{
  int iVar1;
  ostream *poVar2;
  time_point time;
  undefined1 auVar3 [16];
  anon_class_1_0_00000001 version_string;
  ostringstream os;
  undefined1 local_1d9;
  string local_1d8;
  string local_1b8;
  ostringstream local_198 [376];
  
  if (handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,long>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
      ::version_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,long>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                                 ::version_abi_cxx11_);
    if (iVar1 != 0) {
      handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
      ::{lambda()#1}::operator()[abi_cxx11_
                (&handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,long>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                  ::version_abi_cxx11_,&local_1d9);
      __cxa_atexit(std::__cxx11::string::~string,
                   &handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,long>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                    ::version_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,long>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                           ::version_abi_cxx11_);
    }
  }
  if (handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,long>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
      ::modified == '\0') {
    iVar1 = __cxa_guard_acquire(&handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,long>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                                 ::modified);
    if (iVar1 != 0) {
      handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,_-1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
      ::modified.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      __cxa_guard_release(&handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,long>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                           ::modified);
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"HTTP/1.1 200 OK");
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Connection: close");
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Content-length: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Content-type: application/json");
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Date: ");
  auVar3 = std::chrono::_V2::system_clock::now();
  http_date_abi_cxx11_(&local_1d8,auVar3._0_8_,(duration)auVar3._8_8_);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Last-Modified: ");
  http_date_abi_cxx11_
            (&local_1b8,
             (http *)handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,_-1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                     ::modified.__d.__r,time);
  poVar2 = std::operator<<(poVar2,(string *)&local_1b8);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Server: ");
  poVar2 = std::operator<<(poVar2,"pstore-http");
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"\r\n");
  std::operator<<(poVar2,(string *)
                         &handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,long>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                          ::version_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringbuf::str();
  send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (__return_storage_ptr__,this,sender,
             (descriptor<pstore::details::posix_descriptor_traits> *)&local_1d8,(string *)param_3);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> handle_version (Sender sender, IO io, query_container const &) {
            auto version_string = [] () {
                std::ostringstream os;
                os << R"({ "version": ")" << header::major_version << '.' << header::minor_version
                   << "\" }";
                auto const & v = os.str ();
                PSTORE_ASSERT (json::is_valid (v));
                return v;
            };
            static std::string const version = version_string ();
            static auto const modified = std::chrono::system_clock::now ();

            std::ostringstream os;
            os << "HTTP/1.1 200 OK" << crlf                                         //
               << "Connection: close" << crlf                                       //
               << "Content-length: " << version.length () << crlf                   //
               << "Content-type: application/json" << crlf                          //
               << "Date: " << http_date (std::chrono::system_clock::now ()) << crlf //
               << "Last-Modified: " << http_date (modified) << crlf                 //
               << "Server: " << server_name << crlf                                 //
               << crlf // End of headers
               << version;
            return pstore::http::send (sender, io, os.str ());
        }